

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::getGlobalElemDecl(TraverseSchema *this,DOMElement *elem,XMLCh *qName)

{
  uint saveScope_00;
  SchemaInfo *toRestore;
  bool bVar1;
  uint namespaceURI;
  uint uVar2;
  int iVar3;
  XMLCh *pXVar4;
  XMLCh *text2;
  Grammar *pGVar5;
  undefined4 extraout_var;
  SchemaInfo *this_00;
  undefined4 extraout_var_00;
  DOMElement *elem_00;
  DOMElement *subsGroupElem;
  SchemaInfo *impInfo;
  Grammar *grammar;
  uint uriId;
  uint saveScope;
  ListType infoType;
  SchemaInfo *saveInfo;
  SchemaElementDecl *elemDecl;
  XMLCh *localPart;
  XMLCh *nameURI;
  XMLCh *qName_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  pXVar4 = getPrefix(this,qName);
  pXVar4 = resolvePrefixToURI(this,elem,pXVar4);
  text2 = getLocalPart(this,qName);
  toRestore = this->fSchemaInfo;
  uriId = 2;
  saveScope_00 = this->fCurrentScope;
  namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                           (this->fURIStringPool,pXVar4);
  uVar2 = SchemaInfo::getTargetNSURI(this->fSchemaInfo);
  if (uVar2 == namespaceURI) {
    iVar3 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                      (this->fSchemaGrammar,(ulong)(uint)this->fTargetNSURI,text2,0,0xfffffffe);
    saveInfo = (SchemaInfo *)CONCAT44(extraout_var_00,iVar3);
  }
  else {
    bVar1 = isImportingNS(this,namespaceURI);
    if (!bVar1) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,pXVar4,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      return (SchemaElementDecl *)0x0;
    }
    pGVar5 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar4);
    if ((pGVar5 == (Grammar *)0x0) ||
       (iVar3 = (*(pGVar5->super_XSerializable)._vptr_XSerializable[5])(), iVar3 != 1)) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x26,pXVar4,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      return (SchemaElementDecl *)0x0;
    }
    iVar3 = (*(pGVar5->super_XSerializable)._vptr_XSerializable[0xb])
                      (pGVar5,(ulong)namespaceURI,text2,0,0xfffffffe);
    saveInfo = (SchemaInfo *)CONCAT44(extraout_var,iVar3);
    if (saveInfo == (SchemaInfo *)0x0) {
      this_00 = SchemaInfo::getImportInfo(this->fSchemaInfo,namespaceURI);
      if ((this_00 == (SchemaInfo *)0x0) || (bVar1 = SchemaInfo::getProcessed(this_00), bVar1)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,pXVar4,text2,(XMLCh *)0x0,
                          (XMLCh *)0x0);
        return (SchemaElementDecl *)0x0;
      }
      uriId = 1;
      restoreSchemaInfo(this,this_00,IMPORT,0xfffffffe);
    }
  }
  if (saveInfo == (SchemaInfo *)0x0) {
    elem_00 = SchemaInfo::getTopLevelComponent
                        (this->fSchemaInfo,5,(XMLCh *)SchemaSymbols::fgELT_ELEMENT,text2,
                         &this->fSchemaInfo);
    if (elem_00 != (DOMElement *)0x0) {
      saveInfo = (SchemaInfo *)traverseElementDecl(this,elem_00,true);
    }
    if (saveInfo == (SchemaInfo *)0x0) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,pXVar4,text2,(XMLCh *)0x0,
                        (XMLCh *)0x0);
    }
  }
  if (toRestore != this->fSchemaInfo) {
    restoreSchemaInfo(this,toRestore,uriId,saveScope_00);
  }
  return (SchemaElementDecl *)saveInfo;
}

Assistant:

SchemaElementDecl*
TraverseSchema::getGlobalElemDecl(const DOMElement* const elem,
                                  const XMLCh* const qName)
{
    const XMLCh*         nameURI =  resolvePrefixToURI(elem, getPrefix(qName));
    const XMLCh*         localPart = getLocalPart(qName);
    SchemaElementDecl*   elemDecl = 0;
    SchemaInfo*          saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;
    unsigned int         uriId = fURIStringPool->addOrFind(nameURI);

    if (fSchemaInfo->getTargetNSURI() != (int) uriId)
    {
    //if (!XMLString::equals(nameURI, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        if (!isImportingNS(uriId))
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, nameURI);
            return 0;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(nameURI);

        if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType)
        {
            elemDecl = (SchemaElementDecl*) grammar->getElemDecl(
                uriId, localPart, 0, Grammar::TOP_LEVEL_SCOPE);
        }
        else
        {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, nameURI);
            return 0;
        }

        if (!elemDecl)
        {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);
            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, nameURI, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }
    else
    {
        elemDecl = (SchemaElementDecl*)
            fSchemaGrammar->getElemDecl(fTargetNSURI, localPart, 0, Grammar::TOP_LEVEL_SCOPE);
    }

    if (!elemDecl)
    {
        DOMElement* subsGroupElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Element,
            SchemaSymbols::fgELT_ELEMENT,localPart, &fSchemaInfo);

        if (subsGroupElem)
            elemDecl = traverseElementDecl(subsGroupElem, true);

        if (!elemDecl)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, nameURI, localPart);
    }

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    return elemDecl;
}